

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::List<Func*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
Copy<JsUtil::List<Func*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
          (List<Func*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this,
          List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *list)

{
  ulong uVar1;
  int32 requiredCapacity;
  
  requiredCapacity =
       (list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>).count;
  if (0 < requiredCapacity) {
    List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)this,requiredCapacity);
    if ((0x1fffffff < (ulong)*(uint *)(this + 0x20)) ||
       (uVar1 = (ulong)(uint)(list->
                             super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>)
                             .count, 0x1fffffff < uVar1)) {
      Math::DefaultOverflowPolicy();
    }
    js_memcpy_s(*(void **)(this + 8),(ulong)*(uint *)(this + 0x20) << 3,
                (list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>).
                buffer,uVar1 << 3);
    requiredCapacity =
         (list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>).count;
  }
  *(int32 *)(this + 0x10) = requiredCapacity;
  return;
}

Assistant:

void Copy(const U* list)
        {
            CompileAssert(sizeof(TElementType) == sizeof(typename U::TElementType));
            if (list->Count() > 0)
            {
                this->EnsureArray(list->Count());
                js_memcpy_s(this->buffer, UInt32Math::Mul(sizeof(TElementType), this->length), list->GetBuffer(), UInt32Math::Mul(sizeof(TElementType), list->Count()));
            }
            this->count = list->Count();
        }